

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

Value * DumpVersion(Value *__return_storage_ptr__,int major,int minor)

{
  Value *pVVar1;
  Value local_80;
  Value local_48;
  undefined1 local_19;
  int local_18;
  Int local_14;
  int minor_local;
  int major_local;
  Value *version;
  
  local_19 = 0;
  local_18 = minor;
  local_14 = major;
  _minor_local = __return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_48,local_14);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"major");
  Json::Value::operator=(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&local_80,local_18);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"minor");
  Json::Value::operator=(pVVar1,&local_80);
  Json::Value::~Value(&local_80);
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpVersion(int major, int minor)
{
  Json::Value version = Json::objectValue;
  version["major"] = major;
  version["minor"] = minor;
  return version;
}